

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.hpp
# Opt level: O3

VList * Kernel::freeVariables<Kernel::Term*>(Term *thing)

{
  VList *pVVar1;
  bool bVar2;
  uint uVar3;
  List<unsigned_int> *pLVar4;
  VList *pVVar5;
  VList *pVVar6;
  FormulaVarIterator fvi;
  FormulaVarIterator local_100;
  
  FormulaVarIterator::FormulaVarIterator(&local_100,thing);
  pLVar4 = (VList *)0x0;
  pVVar1 = (VList *)0x0;
  while (pVVar5 = pVVar1, pVVar6 = pLVar4, bVar2 = FormulaVarIterator::hasNext(&local_100), bVar2) {
    uVar3 = FormulaVarIterator::next(&local_100);
    pLVar4 = (List<unsigned_int> *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar4->_head = uVar3;
    pLVar4->_tail = (List<unsigned_int> *)0x0;
    pVVar1 = pLVar4;
    if (pVVar6 != (VList *)0x0) {
      pVVar6->_tail = pLVar4;
      pVVar1 = pVVar5;
    }
  }
  FormulaVarIterator::~FormulaVarIterator(&local_100);
  return pVVar5;
}

Assistant:

VList* freeVariables(T thing)
{
  FormulaVarIterator fvi(thing);
  VList::FIFO result;
  while (fvi.hasNext()) {
    result.pushBack(fvi.next());
  }
  return result.list();
}